

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.cpp
# Opt level: O3

void __thiscall ncnn::PoolAllocator::~PoolAllocator(PoolAllocator *this)

{
  list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_> *plVar1
  ;
  _List_node_base *p_Var2;
  _Node *__tmp;
  _List_node_base *p_Var3;
  
  (this->super_Allocator)._vptr_Allocator = (_func_int **)&PTR__PoolAllocator_00170640;
  clear(this);
  plVar1 = &this->payouts;
  p_Var3 = (this->payouts).
           super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var3 != (_List_node_base *)plVar1) {
    fwrite("FATAL ERROR! pool allocator destroyed too early\n",0x30,1,_stderr);
    p_Var3 = (plVar1->
             super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
             )._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var3 != (_List_node_base *)plVar1) {
      do {
        fprintf(_stderr,"%p still in use\n",p_Var3[1]._M_prev);
        p_Var3 = p_Var3->_M_next;
      } while (p_Var3 != (_List_node_base *)plVar1);
      p_Var3 = (plVar1->
               super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
               )._M_impl._M_node.super__List_node_base._M_next;
    }
  }
  while (p_Var3 != (_List_node_base *)plVar1) {
    p_Var2 = p_Var3->_M_next;
    operator_delete(p_Var3,0x20);
    p_Var3 = p_Var2;
  }
  p_Var3 = (this->budgets).
           super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  while (p_Var3 != (_List_node_base *)&this->budgets) {
    p_Var2 = p_Var3->_M_next;
    operator_delete(p_Var3,0x20);
    p_Var3 = p_Var2;
  }
  pthread_mutex_destroy((pthread_mutex_t *)&this->payouts_lock);
  pthread_mutex_destroy((pthread_mutex_t *)&this->budgets_lock);
  return;
}

Assistant:

PoolAllocator::~PoolAllocator()
{
    clear();

    if (!payouts.empty())
    {
        fprintf(stderr, "FATAL ERROR! pool allocator destroyed too early\n");
        std::list< std::pair<size_t, void*> >::iterator it = payouts.begin();
        for (; it != payouts.end(); it++)
        {
            void* ptr = it->second;
            fprintf(stderr, "%p still in use\n", ptr);
        }
    }
}